

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTport.c
# Opt level: O0

void sbfTportFirstDestroyStreamCb(int fd,short events,void *closure)

{
  long lVar1;
  sbfTportTopicImpl *psVar2;
  long *in_RDX;
  undefined1 uVar3;
  sbfSub sub;
  sbfPub pub;
  sbfTportTopic ttopic1;
  sbfTportTopic ttopic;
  sbfTport tport;
  sbfTportStream tstream;
  sbfTportDestroyStreamClosure *closure0;
  undefined7 in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  sbfSubImpl *psVar4;
  undefined8 in_stack_ffffffffffffffc0;
  sbfPubImpl *psVar5;
  sbfTportTopicImpl *local_30;
  long local_20;
  
  lVar1 = *in_RDX;
  sbfLog_log(*(undefined8 *)(lVar1 + 8),0,"first destroy callback for stream %p",in_RDX[1]);
  for (local_20 = *(long *)(lVar1 + 0x170); (local_20 != 0 && (local_20 != in_RDX[1]));
      local_20 = *(long *)(local_20 + 0x50)) {
  }
  if (local_20 == 0) {
    sbfLog_log(*(undefined8 *)(lVar1 + 8),0,"stream %p has already been destroyed",in_RDX[1]);
    sbfTportSecondDestroyStreamCb
              ((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               (short)((ulong)in_stack_ffffffffffffffc0 >> 0x10),in_stack_ffffffffffffffb8);
  }
  else {
    local_30 = sbfTportTopicTreeImpl_RB_MINMAX((sbfTportTopicTreeImpl *)(local_20 + 0x20),-1);
    while (uVar3 = local_30 != (sbfTportTopicImpl *)0x0, (bool)uVar3) {
      psVar2 = sbfTportTopicTreeImpl_RB_NEXT(local_30);
      for (psVar5 = (local_30->mPubs).tqh_first; psVar5 != (sbfPubImpl *)0x0;
          psVar5 = (psVar5->mEntry).tqe_next) {
        sbfPub_destroy((sbfPub)CONCAT17(uVar3,in_stack_ffffffffffffffb0));
      }
      for (psVar4 = (local_30->mSubs).tqh_first; local_30 = psVar2, psVar4 != (sbfSubImpl *)0x0;
          psVar4 = (psVar4->mEntry).tqe_next) {
        sbfSub_destroy((sbfSub)CONCAT17(uVar3,in_stack_ffffffffffffffb0));
      }
    }
    sbfMw_enqueueThread(in_RDX[2],in_RDX + 3,sbfTportSecondDestroyStreamCb,in_RDX);
  }
  return;
}

Assistant:

static void
sbfTportFirstDestroyStreamCb (int fd, short events, void* closure)
{
    sbfTportDestroyStreamClosure* closure0 = closure;
    sbfTportStream                tstream;
    sbfTport                      tport = closure0->mTport;
    sbfTportTopic                 ttopic;
    sbfTportTopic                 ttopic1;
    sbfPub                        pub;
    sbfSub                        sub;

    sbfLog_debug (tport->mLog,
                  "first destroy callback for stream %p",
                  closure0->mTportStream);

    /*
     * Removing pubs or subs may already have disposed of the stream so check
     * if it's still on the transport's list.
     */
    TAILQ_FOREACH (tstream, &tport->mStreams, mEntry)
    {
        if (tstream == closure0->mTportStream)
            break;
    }

    if (tstream == NULL)
    {
        sbfLog_debug (tport->mLog,
                      "stream %p has already been destroyed",
                      closure0->mTportStream);
        sbfTportSecondDestroyStreamCb (fd, events, closure);
        return;
    }

    RB_FOREACH_SAFE (ttopic, sbfTportTopicTreeImpl, &tstream->mTopics, ttopic1)
    {
        TAILQ_FOREACH (pub, &ttopic->mPubs, mEntry)
            sbfPub_destroy (pub);
        TAILQ_FOREACH (sub, &ttopic->mSubs, mEntry)
            sbfSub_destroy (sub);
    }

    /*
     * Queue to wakeup after the publisher and subscriber events (which will
     * have freed and removed the stream).
     */
    sbfMw_enqueueThread (closure0->mThread,
                         &closure0->mEvent,
                         sbfTportSecondDestroyStreamCb,
                         closure0);
}